

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  ImGuiWindow *pIVar1;
  undefined1 auVar2 [12];
  ImGuiContext *pIVar3;
  uint uVar4;
  ImU32 col;
  ImU32 IVar5;
  ImGuiCol idx;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar11 [64];
  undefined1 auVar14 [16];
  float fVar12;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar13;
  undefined1 in_register_00001244 [60];
  undefined1 auVar20 [64];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  bool held;
  bool hovered;
  bool local_da;
  bool local_d9;
  ImRect local_d8;
  float local_c0;
  ImDrawCornerFlags local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImVec2 aIStack_40 [2];
  
  pIVar3 = GImGui;
  auVar20._4_60_ = in_register_00001244;
  auVar20._0_4_ = size_contents_v;
  auVar11._4_60_ = in_register_00001204;
  auVar11._0_4_ = size_avail_v;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    local_b8 = auVar20._0_16_;
    local_a8 = auVar11._0_16_;
    auVar7._8_8_ = 0;
    auVar7._0_4_ = (bb_frame->Min).x;
    auVar7._4_4_ = (bb_frame->Min).y;
    auVar14._8_8_ = 0;
    auVar14._0_4_ = (bb_frame->Max).x;
    auVar14._4_4_ = (bb_frame->Max).y;
    auVar7 = vsubps_avx(auVar14,auVar7);
    if (auVar7._0_4_ <= 0.0) {
      return false;
    }
    auVar14 = vmovshdup_avx(auVar7);
    fVar12 = auVar14._0_4_;
    if (fVar12 <= 0.0) {
      return false;
    }
    local_98 = SUB6416(ZEXT464(0x3f800000),0);
    if (axis == ImGuiAxis_Y) {
      fVar13 = (GImGui->Style).FramePadding.y;
      fVar13 = fVar13 + fVar13;
      if (fVar12 < fVar13 + GImGui->FontSize) {
        auVar15._0_4_ = (fVar12 - GImGui->FontSize) / fVar13;
        auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar19 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar15);
        auVar14 = vcmpss_avx(auVar15,ZEXT816(0),1);
        local_98 = vandnps_avx(auVar14,auVar19);
      }
    }
    if (0.0 < local_98._0_4_) {
      auVar2._0_4_ = (bb_frame->Min).x;
      auVar2._4_4_ = (bb_frame->Min).y;
      auVar2._8_4_ = (bb_frame->Max).x;
      local_d8.Max.y = (bb_frame->Max).y;
      auVar6._0_4_ = (int)((auVar7._0_4_ + -2.0) * 0.5);
      auVar6._4_4_ = (int)((auVar7._4_4_ + -2.0) * 0.5);
      auVar6._8_4_ = (int)((auVar7._8_4_ + -2.0) * 0.5);
      auVar6._12_4_ = (int)((auVar7._12_4_ + -2.0) * 0.5);
      auVar7 = vcvtdq2ps_avx(auVar6);
      auVar22._8_4_ = 3;
      auVar22._0_8_ = 0x300000003;
      auVar22._12_4_ = 3;
      auVar14 = vpcmpgtd_avx(auVar6,auVar22);
      auVar23._8_4_ = 0x80000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar23._12_4_ = 0x80000000;
      auVar16._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
      auVar16._8_4_ = auVar7._8_4_ ^ 0x80000000;
      auVar16._12_4_ = auVar7._12_4_ ^ 0x80000000;
      auVar24._8_4_ = 0xc0400000;
      auVar24._0_8_ = 0xc0400000c0400000;
      auVar24._12_4_ = 0xc0400000;
      auVar7 = vblendvps_avx(auVar16,auVar24,auVar14);
      auVar7 = vblendvps_avx(auVar7,auVar23,auVar6);
      auVar17._8_8_ = auVar7._0_8_;
      auVar17._0_8_ = auVar7._0_8_;
      auVar19._12_4_ = local_d8.Max.y;
      auVar19._0_12_ = auVar2;
      auVar14 = vsubps_avx(auVar19,auVar17);
      auVar18._0_4_ = (float)auVar2._0_4_ + auVar7._0_4_;
      auVar18._4_4_ = (float)auVar2._4_4_ + auVar7._4_4_;
      auVar18._8_4_ = (float)auVar2._8_4_ + auVar7._0_4_;
      auVar18._12_4_ = local_d8.Max.y + auVar7._4_4_;
      local_d8.Min.x = auVar14._0_4_;
      local_d8.Min.y = auVar14._4_4_;
      auVar7 = vshufpd_avx(auVar18,auVar18,1);
      if (axis == ImGuiAxis_X) {
        local_78 = ZEXT416((uint)(auVar7._0_4_ - local_d8.Min.x));
      }
      else {
        auVar7 = vsubps_avx(auVar7,auVar14);
        local_78 = vmovshdup_avx(auVar7);
      }
      auVar7 = vcmpss_avx(local_a8,local_b8,2);
      auVar7 = vblendvps_avx(local_a8,local_b8,auVar7);
      local_d8.Max.x = auVar18._8_4_;
      local_d8.Max.y = auVar18._12_4_;
      local_bc = rounding_corners;
      if (0.0 < auVar7._0_4_) {
        auVar7 = vmaxss_avx(auVar7,ZEXT416(0x3f800000));
        auVar7 = ZEXT416((uint)((size_avail_v / auVar7._0_4_) * local_78._0_4_));
        auVar14 = vminss_avx(local_78,auVar7);
        auVar19 = ZEXT416((uint)(GImGui->Style).GrabMinSize);
        auVar7 = vcmpss_avx(auVar7,auVar19,1);
        local_88 = vblendvps_avx(auVar14,auVar19,auVar7);
        local_da = false;
        local_d9 = false;
        ButtonBehavior(&local_d8,id,&local_d9,&local_da,0x40000);
        auVar7 = vinsertps_avx(local_88,ZEXT416((uint)*p_scroll_v),0x1c);
        auVar15 = SUB6416(ZEXT464(0x3f800000),0);
        auVar19 = vmaxss_avx(auVar15,ZEXT416((uint)((float)local_b8._0_4_ - (float)local_a8._0_4_)))
        ;
        auVar14 = vinsertps_avx(local_78,auVar19,0x10);
        auVar14 = vdivps_avx(auVar7,auVar14);
        auVar7 = vcmpps_avx(auVar14,SUB6416(ZEXT464(0x3f800000),0),1);
        auVar7 = vshufps_avx(auVar7,auVar7,0x50);
        uVar4 = vmovmskpd_avx(auVar7);
        fVar12 = 0.0;
        if ((uVar4 & 2) == 0) {
          auVar7 = vmovshdup_avx(auVar14);
          auVar7 = vminss_avx(auVar15,auVar7);
          fVar12 = auVar7._0_4_;
        }
        fVar21 = local_78._0_4_;
        fVar13 = fVar21 - (float)local_88._0_4_;
        local_b8._0_4_ = (fVar13 * fVar12) / fVar21;
        local_b8._4_12_ = SUB6012((undefined1  [60])0x0,0);
        if (((1.0 <= (float)local_98._0_4_) && ((uVar4 & 1) != 0)) && (local_da != false)) {
          local_c0 = fVar13;
          local_a8 = auVar14;
          local_58 = auVar19;
          if (1 < (uint)axis) {
            __assert_fail("idx <= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                          ,0xe9,"float &ImVec2::operator[](size_t)");
          }
          auVar8._0_4_ = (*(float *)((pIVar3->IO).MouseDown + (ulong)(uint)axis * 4 + -8) -
                         (&local_d8.Min.x)[(uint)axis]) / fVar21;
          auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar14 = vminss_avx(auVar15,auVar8);
          auVar7 = vcmpss_avx(auVar8,ZEXT816(0) << 0x20,1);
          local_68 = vandnps_avx(auVar7,auVar14);
          SetHoveredID(id);
          fVar12 = local_68._0_4_;
          if (pIVar3->ActiveIdIsJustActivated == true) {
            auVar7 = vcmpps_avx(local_68,local_b8,1);
            auVar14 = vcmpps_avx(ZEXT416((uint)((float)local_a8._0_4_ + local_b8._0_4_)),local_68,1)
            ;
            auVar7 = vorps_avx(auVar7,auVar14);
            uVar4 = auVar7._0_4_;
            fVar13 = 0.0;
            if ((auVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              fVar13 = (fVar12 - local_b8._0_4_) + (float)local_a8._0_4_ * -0.5;
            }
            pIVar3->ScrollbarClickDeltaToGrabCenter = fVar13;
          }
          else {
            uVar4 = 0;
          }
          auVar9._0_4_ = ((fVar12 - pIVar3->ScrollbarClickDeltaToGrabCenter) -
                         (float)local_a8._0_4_ * 0.5) / (1.0 - (float)local_a8._0_4_);
          auVar9._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
          auVar7 = vcmpss_avx(auVar9,ZEXT816(0) << 0x40,1);
          auVar7 = vandnps_avx(auVar7,auVar14);
          auVar7 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar7._0_4_ * (float)local_58._0_4_ + 0.5)));
          *p_scroll_v = auVar7._0_4_;
          auVar10._0_4_ = auVar7._0_4_ / (float)local_58._0_4_;
          auVar10._4_12_ = auVar7._4_12_;
          auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar10);
          auVar7 = vcmpss_avx(auVar10,ZEXT816(0) << 0x40,1);
          auVar7 = vandnps_avx(auVar7,auVar14);
          fVar13 = (local_c0 * auVar7._0_4_) / (float)local_78._0_4_;
          local_b8 = ZEXT416((uint)fVar13);
          if ((uVar4 & 1) != 0) {
            pIVar3->ScrollbarClickDeltaToGrabCenter =
                 -(float)local_a8._0_4_ * 0.5 + (fVar12 - fVar13);
          }
        }
        col = GetColorU32(0xe,1.0);
        idx = 0x11;
        if (local_da == false) {
          idx = (local_d9 & 1) + 0xf;
        }
        IVar5 = GetColorU32(idx,(float)local_98._0_4_);
        local_98._0_4_ = IVar5;
        ImDrawList::AddRectFilled
                  (pIVar1->DrawList,&bb_frame->Min,&bb_frame->Max,col,pIVar1->WindowRounding,
                   local_bc);
        if (axis == ImGuiAxis_X) {
          local_48.x = (local_d8.Max.x - local_d8.Min.x) * (float)local_b8._0_4_ + local_d8.Min.x;
          aIStack_40[0].x = local_48.x + (float)local_88._0_4_;
          local_48.y = local_d8.Min.y;
          aIStack_40[0].y = local_d8.Max.y;
        }
        else {
          local_48.y = (local_d8.Max.y - local_d8.Min.y) * (float)local_b8._0_4_ + local_d8.Min.y;
          local_48.x = local_d8.Min.x;
          aIStack_40[0].x = local_d8.Max.x;
          aIStack_40[0].y = local_48.y + (float)local_88._0_4_;
        }
        ImDrawList::AddRectFilled
                  (pIVar1->DrawList,&local_48,aIStack_40,local_98._0_4_,
                   (pIVar3->Style).ScrollbarRounding,0xf);
        return local_da;
      }
      __assert_fail("ImMax(size_contents_v, size_avail_v) > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0x3a4,
                    "bool ImGui::ScrollbarEx(const ImRect &, ImGuiID, ImGuiAxis, float *, float, float, ImDrawCornerFlags)"
                   );
    }
  }
  return false;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = bb.Min[axis];
        float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = IM_ROUND(scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, rounding_corners);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}